

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O2

void cp_expr_kint(CPState *cp,CPValue *k)

{
  cp_expr_sub(cp,k,0);
  if (0x3ffffff < cp->cts->tab[k->id].info) {
    cp_err(cp,LJ_ERR_BADVAL);
  }
  return;
}

Assistant:

static void cp_expr_kint(CPState *cp, CPValue *k)
{
  CType *ct;
  cp_expr_sub(cp, k, 0);
  ct = ctype_raw(cp->cts, k->id);
  if (!ctype_isinteger(ct->info)) cp_err(cp, LJ_ERR_BADVAL);
}